

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

void __thiscall kj::Maybe<kj::String>::Maybe(Maybe<kj::String> *this,Maybe<kj::String> *other)

{
  kj::_::NullableValue<kj::String>::NullableValue(&this->ptr,&other->ptr);
  operator=(other);
  return;
}

Assistant:

Maybe(Maybe&& other): ptr(kj::mv(other.ptr)) { other = kj::none; }